

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68020_rtm(m68k_info *info)

{
  byte bVar1;
  
  bVar1 = info->groups_count;
  info->groups_count = bVar1 + 1;
  info->groups[bVar1] = '\x03';
  if ((info->type & 4) == 0) {
    d68000_invalid(info);
    return;
  }
  build_absolute_jump_with_immediate(info,0x142,0,0);
  (info->extension).operands[0].type = M68K_OP_REG;
  (info->extension).operands[0].address_mode = M68K_AM_NONE;
  (info->extension).operands[0].field_0.reg = (info->ir & 0xf) + M68K_REG_D0;
  return;
}

Assistant:

static void d68020_rtm(m68k_info *info)
{
	cs_m68k* ext;
	cs_m68k_op* op;

	set_insn_group(info, M68K_GRP_RET);

	LIMIT_CPU_TYPES(info, M68020_ONLY);

	build_absolute_jump_with_immediate(info, M68K_INS_RTM, 0, 0);

	ext = &info->extension;
	op = &ext->operands[0];

	op->address_mode = M68K_AM_NONE;
	op->type = M68K_OP_REG;

	if (BIT_3(info->ir)) {
		op->reg = M68K_REG_A0 + (info->ir & 7);
	} else {
		op->reg = M68K_REG_D0 + (info->ir & 7);
	}
}